

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

bool __thiscall cs::numeric::operator==(numeric *this,numeric *rhs)

{
  undefined1 uVar1;
  
  uVar1 = (*(code *)(&DAT_002b9b68 +
                    *(int *)(&DAT_002b9b68 + (ulong)(byte)(this->type * '\x02' | rhs->type) * 4)))()
  ;
  return (bool)uVar1;
}

Assistant:

bool operator==(const numeric &rhs) const noexcept
		{
			switch (get_composite_type(type, rhs.type)) {
			default:
			case 0b00:
				return data._num == rhs.data._num;
			case 0b01:
				return data._num == rhs.data._int;
			case 0b10:
				return data._int == rhs.data._num;
			case 0b11:
				return data._int == rhs.data._int;
			}
		}